

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void set_set(t_set *x,t_symbol *templatesym,t_symbol *field)

{
  t_symbol *ptVar1;
  t_symbol *field_local;
  t_symbol *templatesym_local;
  t_set *x_local;
  
  if (x->x_nin == 1) {
    ptVar1 = template_getbindsym(templatesym);
    x->x_templatesym = ptVar1;
    x->x_variables->gv_sym = field;
    if (x->x_issymbol == 0) {
      (x->x_variables->gv_w).w_float = 0.0;
    }
    else {
      (x->x_variables->gv_w).w_symbol = &s_;
    }
  }
  else {
    pd_error(x,"set: cannot set multiple fields.");
  }
  return;
}

Assistant:

static void set_set(t_set *x, t_symbol *templatesym, t_symbol *field)
{
    if (x->x_nin != 1)
        pd_error(x, "set: cannot set multiple fields.");
    else
    {
       x->x_templatesym = template_getbindsym(templatesym);
       x->x_variables->gv_sym = field;
       if (x->x_issymbol)
           x->x_variables->gv_w.w_symbol = &s_;
       else
           x->x_variables->gv_w.w_float = 0;
    }
}